

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visitor_test.cc
# Opt level: O3

void __thiscall
should_visit_repeating_group_in_logon_frame::Visitor::operator()
          (Visitor *this,Ref *param_1,Ref *logon)

{
  Type TVar1;
  bool bVar2;
  InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
  *message;
  InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
  *message_00;
  char *pcVar3;
  undefined1 local_c98 [8];
  Values msgTypes;
  AssertionResult gtest_ar;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30;
  AssertionResult gtest_ar_1;
  
  Fixpp::
  get<Fixpp::TagT<384u,Fixpp::Type::Int>,Fixpp::VersionnedMessageRef<Fixpp::v42::Version,Fixpp::Chars<(char)65>,Fixpp::Required<Fixpp::TagT<98u,Fixpp::Type::Int>>,Fixpp::Required<Fixpp::TagT<108u,Fixpp::Type::Int>>,Fixpp::TagT<95u,Fixpp::Type::Int>,Fixpp::TagT<96u,Fixpp::Type::Data>,Fixpp::TagT<141u,Fixpp::Type::Boolean>,Fixpp::TagT<383u,Fixpp::Type::Int>,Fixpp::SmallRepeatingGroup<Fixpp::TagT<384u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<372u,Fixpp::Type::String>,Fixpp::TagT<385u,Fixpp::Type::Char>>>>
            ((Values *)local_c98,(Fixpp *)logon,logon);
  local_30.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       (((long)msgTypes.
               super_SmallVectorImpl<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>_>
               .
               super_SmallVectorTemplateBase<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>,_false>
               .
               super_SmallVectorTemplateCommon<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>,_void>
               .super_SmallVectorBase.BeginX - (long)local_c98 >> 3) * 0x6f96f96f96f96f97);
  gtest_ar_1.message_.ptr_._0_4_ = 2;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)
             (msgTypes.Storage.InlineElts[8].super_AlignedCharArray<8UL,_312UL>.buffer + 0x130),
             "msgTypes.size()","2",(unsigned_long *)&local_30,(int *)&gtest_ar_1.message_);
  if (msgTypes.Storage.InlineElts[8].super_AlignedCharArray<8UL,_312UL>.buffer[0x130] == '\0') {
    testing::Message::Message((Message *)&local_30);
    if (gtest_ar._0_8_ == 0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Abc-Arbitrage[P]fixpp/tests/visitor_test.cc"
               ,0x99,pcVar3);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar_1.message_,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    if (local_30.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_30.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_30.ptr_ + 8))();
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    if ((undefined1  [8])
        msgTypes.
        super_SmallVectorImpl<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>_>
        .
        super_SmallVectorTemplateBase<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>,_false>
        .
        super_SmallVectorTemplateCommon<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>,_void>
        .super_SmallVectorBase.BeginX == local_c98) {
LAB_0097452f:
      __assert_fail("idx < size()",
                    "/workspace/llm4binary/github/license_c_cmakelists/Abc-Arbitrage[P]fixpp/include/fixpp/utils/SmallVector.h"
                    ,0x182,
                    "reference llvm::SmallVectorTemplateCommon<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384, Fixpp::Type::Int>, Fixpp::SizeHint<10>, Fixpp::TagT<372, Fixpp::Type::String>, Fixpp::TagT<385, Fixpp::Type::Char>>>>::operator[](size_type) [T = Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384, Fixpp::Type::Int>, Fixpp::SizeHint<10>, Fixpp::TagT<372, Fixpp::Type::String>, Fixpp::TagT<385, Fixpp::Type::Char>>>]"
                   );
    }
    Fixpp::
    get<Fixpp::TagT<372u,Fixpp::Type::String>,Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<372u,Fixpp::Type::String>,Fixpp::TagT<385u,Fixpp::Type::Char>>>>
              ((Type *)(msgTypes.Storage.InlineElts[8].super_AlignedCharArray<8UL,_312UL>.buffer +
                       0x130),(Fixpp *)local_c98,message);
    testing::internal::CmpHelperEQ<std::__cxx11::string,char[5]>
              ((internal *)&local_30,"Fixpp::get<Fixpp::Tag::RefMsgType>(msgTypes[0])","\"TEST\"",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (msgTypes.Storage.InlineElts[8].super_AlignedCharArray<8UL,_312UL>.buffer + 0x130),
               (char (*) [5])"TEST");
    if ((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)CONCAT71(msgTypes.Storage.InlineElts[8].super_AlignedCharArray<8UL,_312UL>.buffer._305_7_
                    ,msgTypes.Storage.InlineElts[8].super_AlignedCharArray<8UL,_312UL>.buffer[0x130]
                   ) != &gtest_ar.message_) {
      operator_delete((undefined1 *)
                      CONCAT71(msgTypes.Storage.InlineElts[8].super_AlignedCharArray<8UL,_312UL>.
                               buffer._305_7_,
                               msgTypes.Storage.InlineElts[8].super_AlignedCharArray<8UL,_312UL>.
                               buffer[0x130]),
                      (ulong)((long)&((gtest_ar.message_.ptr_)->_M_dataplus)._M_p + 1));
    }
    if (local_30.ptr_._0_1_ == (internal)0x0) {
      testing::Message::Message
                ((Message *)
                 (msgTypes.Storage.InlineElts[8].super_AlignedCharArray<8UL,_312UL>.buffer + 0x130))
      ;
      if (gtest_ar_1._0_8_ == 0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = *(char **)gtest_ar_1._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_1.message_,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/Abc-Arbitrage[P]fixpp/tests/visitor_test.cc"
                 ,0x9b,pcVar3);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&gtest_ar_1.message_,
                 (Message *)
                 (msgTypes.Storage.InlineElts[8].super_AlignedCharArray<8UL,_312UL>.buffer + 0x130))
      ;
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
      if (CONCAT71(msgTypes.Storage.InlineElts[8].super_AlignedCharArray<8UL,_312UL>.buffer._305_7_,
                   msgTypes.Storage.InlineElts[8].super_AlignedCharArray<8UL,_312UL>.buffer[0x130])
          != 0) {
        bVar2 = testing::internal::IsTrue(true);
        if ((bVar2) &&
           ((long *)CONCAT71(msgTypes.Storage.InlineElts[8].super_AlignedCharArray<8UL,_312UL>.
                             buffer._305_7_,
                             msgTypes.Storage.InlineElts[8].super_AlignedCharArray<8UL,_312UL>.
                             buffer[0x130]) != (long *)0x0)) {
          (**(code **)(*(long *)CONCAT71(msgTypes.Storage.InlineElts[8].
                                         super_AlignedCharArray<8UL,_312UL>.buffer._305_7_,
                                         msgTypes.Storage.InlineElts[8].
                                         super_AlignedCharArray<8UL,_312UL>.buffer[0x130]) + 8))();
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&gtest_ar_1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      ;
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&gtest_ar_1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      ;
      if ((undefined1  [8])
          msgTypes.
          super_SmallVectorImpl<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>_>
          .
          super_SmallVectorTemplateBase<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>,_false>
          .
          super_SmallVectorTemplateCommon<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>,_void>
          .super_SmallVectorBase.BeginX == local_c98) goto LAB_0097452f;
      TVar1 = Fixpp::
              get<Fixpp::TagT<385u,Fixpp::Type::Char>,Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<372u,Fixpp::Type::String>,Fixpp::TagT<385u,Fixpp::Type::Char>>>>
                        ((InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
                          *)local_c98);
      local_30.ptr_._0_1_ = (internal)TVar1;
      gtest_ar_1.message_.ptr_._0_1_ = 0x43;
      testing::internal::CmpHelperEQ<char,char>
                ((internal *)
                 (msgTypes.Storage.InlineElts[8].super_AlignedCharArray<8UL,_312UL>.buffer + 0x130),
                 "Fixpp::get<Fixpp::Tag::MsgDirection>(msgTypes[0])","\'C\'",(char *)&local_30,
                 (char *)&gtest_ar_1.message_);
      if (msgTypes.Storage.InlineElts[8].super_AlignedCharArray<8UL,_312UL>.buffer[0x130] == '\0') {
        testing::Message::Message((Message *)&local_30);
        if (gtest_ar._0_8_ == 0) {
          pcVar3 = "";
        }
        else {
          pcVar3 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_1.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/Abc-Arbitrage[P]fixpp/tests/visitor_test.cc"
                   ,0x9c,pcVar3);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar_1.message_,(Message *)&local_30);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
        if (local_30.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar2 = testing::internal::IsTrue(true);
          if ((bVar2) &&
             (local_30.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(*(long *)local_30.ptr_ + 8))();
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      }
      else {
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        if ((ulong)(((long)msgTypes.
                           super_SmallVectorImpl<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>_>
                           .
                           super_SmallVectorTemplateBase<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>,_false>
                           .
                           super_SmallVectorTemplateCommon<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>,_void>
                           .super_SmallVectorBase.BeginX - (long)local_c98 >> 3) *
                   0x6f96f96f96f96f97) < 2) goto LAB_0097452f;
        Fixpp::
        get<Fixpp::TagT<372u,Fixpp::Type::String>,Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<372u,Fixpp::Type::String>,Fixpp::TagT<385u,Fixpp::Type::Char>>>>
                  ((Type *)(msgTypes.Storage.InlineElts[8].super_AlignedCharArray<8UL,_312UL>.buffer
                           + 0x130),(Fixpp *)((long)local_c98 + 0x138),message_00);
        testing::internal::CmpHelperEQ<std::__cxx11::string,char[5]>
                  ((internal *)&local_30,"Fixpp::get<Fixpp::Tag::RefMsgType>(msgTypes[1])",
                   "\"TEST\"",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (msgTypes.Storage.InlineElts[8].super_AlignedCharArray<8UL,_312UL>.buffer + 0x130
                   ),(char (*) [5])"TEST");
        if ((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)CONCAT71(msgTypes.Storage.InlineElts[8].super_AlignedCharArray<8UL,_312UL>.buffer.
                        _305_7_,msgTypes.Storage.InlineElts[8].super_AlignedCharArray<8UL,_312UL>.
                                buffer[0x130]) != &gtest_ar.message_) {
          operator_delete((undefined1 *)
                          CONCAT71(msgTypes.Storage.InlineElts[8].super_AlignedCharArray<8UL,_312UL>
                                   .buffer._305_7_,
                                   msgTypes.Storage.InlineElts[8].super_AlignedCharArray<8UL,_312UL>
                                   .buffer[0x130]),
                          (ulong)((long)&((gtest_ar.message_.ptr_)->_M_dataplus)._M_p + 1));
        }
        if (local_30.ptr_._0_1_ == (internal)0x0) {
          testing::Message::Message
                    ((Message *)
                     (msgTypes.Storage.InlineElts[8].super_AlignedCharArray<8UL,_312UL>.buffer +
                     0x130));
          if (gtest_ar_1._0_8_ == 0) {
            pcVar3 = "";
          }
          else {
            pcVar3 = *(char **)gtest_ar_1._0_8_;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_1.message_,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/Abc-Arbitrage[P]fixpp/tests/visitor_test.cc"
                     ,0x9e,pcVar3);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar_1.message_,
                     (Message *)
                     (msgTypes.Storage.InlineElts[8].super_AlignedCharArray<8UL,_312UL>.buffer +
                     0x130));
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
          if (CONCAT71(msgTypes.Storage.InlineElts[8].super_AlignedCharArray<8UL,_312UL>.buffer.
                       _305_7_,msgTypes.Storage.InlineElts[8].super_AlignedCharArray<8UL,_312UL>.
                               buffer[0x130]) != 0) {
            bVar2 = testing::internal::IsTrue(true);
            if ((bVar2) &&
               ((long *)CONCAT71(msgTypes.Storage.InlineElts[8].super_AlignedCharArray<8UL,_312UL>.
                                 buffer._305_7_,
                                 msgTypes.Storage.InlineElts[8].super_AlignedCharArray<8UL,_312UL>.
                                 buffer[0x130]) != (long *)0x0)) {
              (**(code **)(*(long *)CONCAT71(msgTypes.Storage.InlineElts[8].
                                             super_AlignedCharArray<8UL,_312UL>.buffer._305_7_,
                                             msgTypes.Storage.InlineElts[8].
                                             super_AlignedCharArray<8UL,_312UL>.buffer[0x130]) + 8))
                        ();
            }
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar_1,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      }
    }
  }
  llvm::
  SmallVectorImpl<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>_>
  ::~SmallVectorImpl((SmallVectorImpl<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>_>
                      *)local_c98);
  return;
}

Assistant:

void operator()(const Fixpp::v42::Header::Ref&, const Fixpp::v42::Message::Logon::Ref& logon)
        {
            auto msgTypes = Fixpp::get<Fixpp::Tag::NoMsgTypes>(logon);
            ASSERT_EQ(msgTypes.size(), 2);

            ASSERT_EQ(Fixpp::get<Fixpp::Tag::RefMsgType>(msgTypes[0]), "TEST");
            ASSERT_EQ(Fixpp::get<Fixpp::Tag::MsgDirection>(msgTypes[0]), 'C');

            ASSERT_EQ(Fixpp::get<Fixpp::Tag::RefMsgType>(msgTypes[1]), "TEST");
        }